

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

unsigned_long flatbuffers::HashFnv1<unsigned_long>(char *input)

{
  byte *local_20;
  char *c;
  unsigned_long hash;
  char *input_local;
  
  c = (char *)0xcbf29ce484222645;
  for (local_20 = (byte *)input; *local_20 != 0; local_20 = local_20 + 1) {
    c = (char *)((ulong)*local_20 ^ (long)c * 0x100000001b3);
  }
  return (unsigned_long)c;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}